

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O0

void __thiscall m2d::savanna::url::url(url *this,string *url)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  const_reference pvVar4;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  cmatch what;
  undefined1 local_38 [8];
  regex ex;
  string *url_local;
  url *this_local;
  
  ex._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)url;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->host_);
  std::__cxx11::string::string((string *)&this->port_);
  std::__cxx11::string::string((string *)&this->path_);
  std::__cxx11::string::string((string *)&this->query_);
  std::__cxx11::string::string((string *)&this->fragment_);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38,
             "(http|https|ws|wss)://([^/ :]+):?([^/ ]*)(/?[^ #?]*)\\x3f?([^ #]*)#?([^ ]*)",0x10);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_68);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = std::
          regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                    (pcVar3,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_68,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38,0);
  if (bVar2) {
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,1);
    pcVar3 = (pvVar4->super_pair<const_char_*,_const_char_*>).first;
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,1);
    pcVar1 = (pvVar4->super_pair<const_char_*,_const_char_*>).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_88,pcVar3,pcVar1,&local_89);
    std::__cxx11::string::operator=((string *)this,local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,2);
    pcVar3 = (pvVar4->super_pair<const_char_*,_const_char_*>).first;
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,2);
    pcVar1 = (pvVar4->super_pair<const_char_*,_const_char_*>).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_b0,pcVar3,pcVar1,&local_b1);
    std::__cxx11::string::operator=((string *)&this->host_,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,3);
    pcVar3 = (pvVar4->super_pair<const_char_*,_const_char_*>).first;
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,3);
    pcVar1 = (pvVar4->super_pair<const_char_*,_const_char_*>).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_d8,pcVar3,pcVar1,&local_d9);
    std::__cxx11::string::operator=((string *)&this->port_,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,4);
    pcVar3 = (pvVar4->super_pair<const_char_*,_const_char_*>).first;
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,4);
    pcVar1 = (pvVar4->super_pair<const_char_*,_const_char_*>).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_100,pcVar3,pcVar1,&local_101);
    std::__cxx11::string::operator=((string *)&this->path_,local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator(&local_101);
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,5);
    pcVar3 = (pvVar4->super_pair<const_char_*,_const_char_*>).first;
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,5);
    pcVar1 = (pvVar4->super_pair<const_char_*,_const_char_*>).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_128,pcVar3,pcVar1,&local_129);
    std::__cxx11::string::operator=((string *)&this->query_,local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,6);
    pcVar3 = (pvVar4->super_pair<const_char_*,_const_char_*>).first;
    pvVar4 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_68,6);
    pcVar1 = (pvVar4->super_pair<const_char_*,_const_char_*>).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_150,pcVar3,pcVar1,&local_151);
    std::__cxx11::string::operator=((string *)&this->fragment_,local_150);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_68);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_38);
  return;
}

Assistant:

url(std::string url)
		{
			std::regex ex("(http|https|ws|wss)://([^/ :]+):?([^/ ]*)(/?[^ #?]*)\\x3f?([^ #]*)#?([^ ]*)");
			std::cmatch what;
			if (regex_match(url.c_str(), what, ex)) {
				scheme_ = std::string(what[1].first, what[1].second);
				host_ = std::string(what[2].first, what[2].second);
				port_ = std::string(what[3].first, what[3].second);
				path_ = std::string(what[4].first, what[4].second);
				query_ = std::string(what[5].first, what[5].second);
				fragment_ = std::string(what[6].first, what[6].second);
			}
		}